

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QVariant>::erase
          (QMovableArrayOps<QVariant> *this,QVariant *b,qsizetype n)

{
  qsizetype *pqVar1;
  QVariant *pQVar2;
  long lVar3;
  QVariant *__src;
  
  lVar3 = n * 0x20;
  pQVar2 = b;
  if (n != 0) {
    do {
      ::QVariant::~QVariant(pQVar2);
      lVar3 = lVar3 + -0x20;
      pQVar2 = pQVar2 + 1;
    } while (lVar3 != 0);
  }
  __src = b + n;
  pQVar2 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
  if ((pQVar2 == b) &&
     (__src != pQVar2 + (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.
                        size)) {
    (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr = __src;
  }
  else if (__src != pQVar2 + (this->super_QGenericArrayOps<QVariant>).
                             super_QArrayDataPointer<QVariant>.size) {
    memmove(b,__src,(long)(pQVar2 + (this->super_QGenericArrayOps<QVariant>).
                                    super_QArrayDataPointer<QVariant>.size) - (long)__src);
  }
  pqVar1 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
  *pqVar1 = *pqVar1 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }